

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O3

string * __thiscall
svg::LineChart::polylineToString_abi_cxx11_
          (string *__return_storage_ptr__,LineChart *this,Polyline *polyline,Layout *layout)

{
  size_type *psVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  Dimensions *pDVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pPVar10;
  undefined8 uVar11;
  bool bVar12;
  vector<svg::Circle,_std::allocator<svg::Circle>_> vertices;
  vector<svg::Circle,_std::allocator<svg::Circle>_> local_188;
  vector<svg::Circle,_std::allocator<svg::Circle>_> local_170;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  LineChart *local_138;
  string local_130;
  Circle local_110;
  Polyline local_a0;
  
  local_a0.super_Shape.fill.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Fill_0010ebc0;
  local_a0.super_Shape.fill.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_0010eaa0;
  local_a0.super_Shape.fill.color.transparent = (polyline->super_Shape).fill.color.transparent;
  local_a0.super_Shape.fill.color._9_3_ =
       *(undefined3 *)&(polyline->super_Shape).fill.color.field_0x9;
  local_a0.super_Shape.fill.color.red = (polyline->super_Shape).fill.color.red;
  local_a0.super_Shape.fill.color.green = (polyline->super_Shape).fill.color.green;
  local_a0.super_Shape.fill.color.blue = (polyline->super_Shape).fill.color.blue;
  local_a0.super_Shape.stroke.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Stroke_0010eaf0;
  local_a0.super_Shape.stroke.width = (polyline->super_Shape).stroke.width;
  local_a0.super_Shape.stroke.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_0010eaa0;
  local_a0.super_Shape.stroke.color.transparent = (polyline->super_Shape).stroke.color.transparent;
  local_a0.super_Shape.stroke.color._9_3_ =
       *(undefined3 *)&(polyline->super_Shape).stroke.color.field_0x9;
  local_a0.super_Shape.stroke.color.red = (polyline->super_Shape).stroke.color.red;
  local_a0.super_Shape.stroke.color.green = (polyline->super_Shape).stroke.color.green;
  local_a0.super_Shape.stroke.color.blue = (polyline->super_Shape).stroke.color.blue;
  local_a0.super_Shape.stroke.nonScaling = (polyline->super_Shape).stroke.nonScaling;
  local_a0.super_Shape.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Polyline_0010ec48;
  std::vector<svg::Point,_std::allocator<svg::Point>_>::vector(&local_a0.points,&polyline->points);
  if ((long)local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    local_188.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    dVar3 = (this->margin).width;
    dVar4 = (this->margin).height;
    uVar7 = 1;
    pPVar10 = local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pPVar10->x = pPVar10->x + dVar3;
      pPVar10->y = pPVar10->y + dVar4;
      uVar8 = (ulong)uVar7;
      pPVar10 = pPVar10 + 1;
      uVar7 = uVar7 + 1;
    } while (uVar8 < (ulong)((long)local_a0.points.
                                   super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a0.points.
                                   super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 4));
    local_188.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138 = this;
    if (local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar8 = 0;
      uVar9 = 1;
      do {
        pPVar10 = local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        getDimensions((optional<svg::Dimensions> *)&local_130,local_138);
        pDVar5 = optional<svg::Dimensions>::operator->((optional<svg::Dimensions> *)&local_130);
        local_110.super_Shape.fill.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Fill_0010ebc0;
        local_110.super_Shape.fill.color.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Serializeable_0010eaa0;
        local_110.super_Shape.fill.color.transparent = false;
        local_110.super_Shape.fill.color.red = 0;
        local_110.super_Shape.fill.color.green = 0;
        local_110.super_Shape.fill.color.blue = 0;
        local_110.super_Shape.stroke.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Stroke_0010eaf0;
        local_110.super_Shape.stroke.width = -1.0;
        local_110.super_Shape.stroke.color.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Serializeable_0010eaa0;
        local_110.super_Shape.stroke.color.transparent = true;
        local_110.super_Shape.stroke.color.blue = 0;
        local_110.super_Shape.stroke.nonScaling = false;
        local_110.super_Shape.stroke.color._12_5_ = 0;
        local_110.super_Shape.stroke.color.green._1_3_ = 0;
        local_110.super_Shape.super_Serializeable._vptr_Serializeable =
             (_func_int **)&PTR__Shape_0010ec90;
        local_110.center.x = pPVar10[uVar8].x;
        local_110.center.y = pPVar10[uVar8].y;
        local_110.radius = (pDVar5->height / 30.0) * 0.5;
        std::vector<svg::Circle,_std::allocator<svg::Circle>_>::emplace_back<svg::Circle>
                  (&local_188,&local_110);
        bVar12 = uVar9 < (ulong)((long)local_a0.points.
                                       super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_a0.points.
                                       super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 4);
        uVar8 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar12);
    }
  }
  Polyline::toString_abi_cxx11_(&local_130,&local_a0,layout);
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::vector(&local_170,&local_188);
  local_150 = 0;
  local_148 = 0;
  local_158 = &local_148;
  if (local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      (*local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8].super_Shape.super_Serializeable._vptr_Serializeable
        [2])(&local_110,
             local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
             super__Vector_impl_data._M_start + uVar8,layout);
      std::__cxx11::string::_M_append
                ((char *)&local_158,
                 (ulong)local_110.super_Shape.super_Serializeable._vptr_Serializeable);
      if ((Color *)local_110.super_Shape.super_Serializeable._vptr_Serializeable !=
          &local_110.super_Shape.fill.color) {
        operator_delete(local_110.super_Shape.super_Serializeable._vptr_Serializeable);
      }
      uVar8 = ((long)local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl
                     .super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      bVar12 = uVar9 <= uVar8;
      lVar2 = uVar8 - uVar9;
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar12 && lVar2 != 0);
  }
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    uVar11 = local_130.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_150 + local_130._M_string_length) {
    uVar8 = 0xf;
    if (local_158 != &local_148) {
      uVar8 = CONCAT71(uStack_147,local_148);
    }
    if (local_150 + local_130._M_string_length <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_158,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
      goto LAB_00107263;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_158);
LAB_00107263:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar1) {
    uVar11 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar11;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::~vector(&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::~vector(&local_188);
  local_a0.super_Shape.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Polyline_0010ec48;
  if (local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string polylineToString(Polyline const & polyline, Layout const & layout) const
        {
            Polyline shifted_polyline = polyline;
            shifted_polyline.offset(Point(margin.width, margin.height));

            std::vector<Circle> vertices;
            for (unsigned i = 0; i < shifted_polyline.points.size(); ++i)
                vertices.push_back(Circle(shifted_polyline.points[i], getDimensions()->height / 30.0, Color::Black));

            return shifted_polyline.toString(layout) + vectorToString(vertices, layout);
        }